

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  Clock *pCVar1;
  iterator iVar2;
  undefined4 in_register_0000000c;
  char *pcVar3;
  uint in_R8D;
  _Base_ptr *pp_Var4;
  StringPtr value;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var5;
  EntryImpl entry;
  Array<char> local_d8;
  EntryImpl local_b8;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_78;
  
  value.content.size_ = (char *)CONCAT44(in_register_0000000c,mode);
  pcVar3 = name.content.ptr;
  value.content.ptr = value.content.size_;
  heapString((String *)&local_d8,(kj *)name.content.size_,value);
  if ((in_R8D & 1) == 0) {
    if ((in_R8D & 2) == 0) {
      this->clock = (Clock *)0x0;
    }
    else {
      local_78.first.content.ptr = local_d8.ptr;
      if (local_d8.size_ == 0) {
        local_78.first.content.ptr = "";
      }
      local_78.first.content.size_ = local_d8.size_ + (local_d8.size_ == 0);
      iVar2 = std::
              map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
              ::find((map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                      *)(pcVar3 + 0x10),&local_78.first);
      pCVar1 = (Clock *)0x0;
      if (iVar2._M_node != (_Base_ptr)(pcVar3 + 0x18)) {
        pCVar1 = (Clock *)&iVar2._M_node[1]._M_left;
      }
      this->clock = pCVar1;
    }
  }
  else {
    local_b8.name.content.ptr = local_d8.ptr;
    local_b8.name.content.size_ = local_d8.size_;
    local_b8.name.content.disposer = local_d8.disposer;
    local_b8.node.tag = 0;
    local_78.first.content.ptr = "";
    if (local_d8.size_ != 0) {
      local_78.first.content.ptr = local_d8.ptr;
    }
    local_78.first.content.size_ = local_d8.size_ + (local_d8.size_ == 0);
    local_d8.ptr = (char *)0x0;
    local_d8.size_ = 0;
    EntryImpl::EntryImpl(&local_78.second,&local_b8);
    _Var5 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                        *)(pcVar3 + 0x10),&local_78);
    EntryImpl::~EntryImpl(&local_78.second);
    pp_Var4 = &_Var5.first._M_node._M_node[1]._M_left;
    pCVar1 = (Clock *)0x0;
    if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pCVar1 = (Clock *)pp_Var4;
    }
    if ((in_R8D & 2) != 0) {
      pCVar1 = (Clock *)pp_Var4;
    }
    this->clock = pCVar1;
    EntryImpl::~EntryImpl(&local_b8);
  }
  Array<char>::~Array(&local_d8);
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }